

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::MakeFn(VirtualMachine *this)

{
  bool bVar1;
  size_t sVar2;
  element_type *peVar3;
  size_type sVar4;
  Function *fn_00;
  const_reference pvVar5;
  vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_> *this_00;
  ClosureContext local_88;
  reference local_78;
  ClosureContext *closure;
  const_iterator __end1;
  const_iterator __begin1;
  vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_> *__range1;
  Function *fn;
  allocator<char> local_39;
  string local_38;
  size_t local_18;
  size_t index;
  VirtualMachine *this_local;
  
  index = (size_t)this;
  sVar2 = getByteCodeParameter(this);
  local_18 = sVar2;
  peVar3 = std::
           __shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->file);
  sVar4 = std::vector<bytecode::Function,_std::allocator<bytecode::Function>_>::size
                    (&peVar3->functions);
  if (sVar4 <= sVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Index out of bounds in MakeFn",&local_39);
    panic(this,&local_38);
  }
  fn_00 = Heap::NewFunction(&this->heap);
  peVar3 = std::
           __shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->file);
  pvVar5 = std::vector<bytecode::Function,_std::allocator<bytecode::Function>_>::at
                     (&peVar3->functions,local_18);
  fn_00->fn = pvVar5;
  std::vector<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>::clear
            (&fn_00->captures);
  this_00 = &fn_00->fn->closures;
  __end1 = std::vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>::begin
                     (this_00);
  closure = (ClosureContext *)
            std::vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>::end
                      (this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_bytecode::ClosureContext_*,_std::vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>_>
                                *)&closure);
    if (!bVar1) break;
    local_78 = __gnu_cxx::
               __normal_iterator<const_bytecode::ClosureContext_*,_std::vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>_>
               ::operator*(&__end1);
    local_88 = loadClosure(this,local_78);
    std::vector<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>::push_back
              (&fn_00->captures,&local_88);
    __gnu_cxx::
    __normal_iterator<const_bytecode::ClosureContext_*,_std::vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>_>
    ::operator++(&__end1);
  }
  std::shared_ptr<runtime::StackFrame>::operator=(&fn_00->scopeOuter,&this->stackFrame);
  pushFunction(this,fn_00);
  advance(this);
  return;
}

Assistant:

void runtime::VirtualMachine::MakeFn() {
  std::size_t index = this->getByteCodeParameter();

  if (index >= this->file->functions.size()) {
    this->panic("Index out of bounds in MakeFn");
    return;
  }

  runtime::Function* fn = this->heap.NewFunction();
  fn->fn = &this->file->functions.at(index);
  fn->captures.clear();

  for (const auto& closure : fn->fn->closures) {
    fn->captures.push_back(this->loadClosure(closure));
  }

  fn->scopeOuter = this->stackFrame;

  this->pushFunction(fn);

  this->advance();
}